

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h2h3.c
# Opt level: O3

CURLcode Curl_pseudo_headers(Curl_easy *data,char *mem,size_t len,h2h3req **hp)

{
  char **ppcVar1;
  char cVar2;
  connectdata *pcVar3;
  size_t sVar4;
  size_t sVar5;
  h2h3req *phVar6;
  int iVar7;
  ulong uVar8;
  h2h3req *phVar9;
  char *pcVar10;
  void *pvVar11;
  size_t sVar12;
  char *pcVar13;
  long lVar14;
  char *pcVar15;
  ulong uVar16;
  size_t sVar17;
  long lVar18;
  size_t sVar19;
  char *second;
  char *first;
  size_t *psVar20;
  bool bVar21;
  h2h3pseudo authority;
  ulong local_80;
  ulong local_60;
  
  if (1 < len) {
    pcVar3 = data->conn;
    uVar8 = 1;
    uVar16 = 0;
    do {
      if ((mem[uVar8] == '\n') && (mem[uVar8 - 1] == '\r')) {
        uVar16 = uVar16 + 1;
        uVar8 = uVar8 + 1;
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 < len);
    if ((1 < uVar16) &&
       (phVar9 = (h2h3req *)(*Curl_cmalloc)(uVar16 * 0x20 + 0x28), phVar9 != (h2h3req *)0x0)) {
      pcVar10 = (char *)memchr(mem,0xd,len);
      if (pcVar10 != (char *)0x0) {
        pvVar11 = memchr(mem,0x20,(long)pcVar10 - (long)mem);
        if ((long)pvVar11 - (long)mem != 0 && pvVar11 != (void *)0x0) {
          phVar9->header[0].name = ":method";
          phVar9->header[0].namelen = 7;
          phVar9->header[0].value = mem;
          phVar9->header[0].valuelen = (long)pvVar11 - (long)mem;
          if (pcVar10 != (char *)((long)pvVar11 + 1)) {
            sVar17 = uVar16 + 1;
            pcVar15 = pcVar10 + (-2 - (long)pvVar11);
            do {
              if (pcVar15[(long)pvVar11 + 1] == ' ') {
                if (pcVar15 != (char *)0x0) {
                  phVar9[1].entries = (size_t)":path";
                  phVar9[1].header[0].name = (char *)0x5;
                  phVar9[1].header[0].namelen = (size_t)((long)pvVar11 + 1);
                  phVar9[1].header[0].value = pcVar15;
                  phVar9[1].header[0].valuelen = (size_t)":scheme";
                  phVar9[2].entries = 7;
                  pcVar15 = Curl_checkheaders(data,":scheme",7);
                  if (pcVar15 == (char *)0x0) {
                    if ((pcVar3->handler->flags & 1) == 0) {
                      pcVar15 = "http";
                    }
                    else {
                      pcVar15 = "https";
                    }
                    phVar9[2].header[0].name = pcVar15;
                  }
                  else {
                    for (pcVar15 = pcVar15 + 8; (*pcVar15 == ' ' || (*pcVar15 == '\t'));
                        pcVar15 = pcVar15 + 1) {
                    }
                    phVar9[2].header[0].name = pcVar15;
                    Curl_infof(data,"set pseudo header %s to %s",":scheme",pcVar15);
                    pcVar15 = phVar9[2].header[0].name;
                  }
                  sVar12 = strlen(pcVar15);
                  phVar9[2].header[0].namelen = sVar12;
                  if (sVar17 < 4) goto LAB_0052d77e;
                  local_80 = 3;
                  local_60 = 0;
                  do {
                    pcVar15 = pcVar10 + 2;
                    pcVar13 = (char *)memchr(pcVar15,0xd,(size_t)(mem + (len - (long)pcVar15)));
                    if ((((pcVar13 == (char *)0x0) || (pcVar13 == pcVar15)) || (*pcVar15 == '\t'))
                       || ((*pcVar15 == ' ' || (pcVar13 <= pcVar15)))) break;
                    lVar14 = (long)pcVar13 - (long)pcVar10;
                    lVar18 = 2;
                    do {
                      if (pcVar10[lVar18] == ':') {
                        lVar14 = lVar18;
                        second = pcVar10 + lVar18;
                        break;
                      }
                      lVar18 = lVar18 + 1;
                      second = pcVar13;
                    } while (lVar14 != lVar18);
                    if ((lVar14 == 2) || (second == pcVar13)) break;
                    sVar19 = lVar14 - 2;
                    if ((sVar19 == 4) &&
                       (iVar7 = Curl_strncasecompare("host",pcVar15,4), iVar7 != 0)) {
                      phVar9->header[local_80].name = ":authority";
                      phVar9->header[local_80].namelen = 10;
                      pcVar15 = ":authority";
                      local_60 = local_80;
                    }
                    else {
                      phVar9->header[local_80].namelen = sVar19;
                      Curl_strntolower(pcVar15,pcVar15,sVar19);
                      phVar9->header[local_80].name = pcVar15;
                    }
                    pcVar10 = pcVar13 + ~(ulong)second;
                    while( true ) {
                      second = second + 1;
                      if ((*second != ' ') && (*second != '\t')) break;
                      pcVar10 = pcVar10 + -1;
                    }
                    sVar19 = phVar9->header[local_80].namelen;
                    if ((long)sVar19 < 10) {
                      if (sVar19 == 2) {
                        iVar7 = Curl_strncasecompare("te",pcVar15,2);
                        if (iVar7 != 0) {
                          while (second != pcVar13) {
                            if ((*second == ' ') || (*second == '\t')) {
                              second = second + 1;
                            }
                            else {
                              if ((ulong)((long)pcVar13 - (long)second) < 8) break;
                              iVar7 = Curl_strncasecompare("trailers",second,8);
                              if (iVar7 != 0) {
                                second = second + 8;
                                pcVar10 = (char *)0x8;
                                while( true ) {
                                  if (second == pcVar13) goto LAB_0052d6ff;
                                  cVar2 = *second;
                                  if ((cVar2 != '\t') && (cVar2 != ' ')) break;
                                  second = second + 1;
                                }
                                if (cVar2 == ',') {
LAB_0052d6ff:
                                  second = "trailers";
                                  goto LAB_0052d6d8;
                                }
                              }
                              do {
                                if (second == pcVar13) goto LAB_0052d626;
                                cVar2 = *second;
                                second = second + 1;
                              } while (cVar2 != ',');
                            }
                          }
                          goto LAB_0052d626;
                        }
                      }
                      else if (sVar19 == 7) {
                        sVar19 = 7;
                        first = "upgrade";
                        goto LAB_0052d614;
                      }
LAB_0052d6d8:
                      phVar9->header[local_80].value = second;
                      phVar9->header[local_80].valuelen = (size_t)pcVar10;
                      local_80 = local_80 + 1;
                    }
                    else {
                      if (sVar19 == 10) {
                        iVar7 = Curl_strncasecompare("connection",pcVar15,10);
                        if (iVar7 == 0) {
                          sVar19 = 10;
                          first = "keep-alive";
                          goto LAB_0052d614;
                        }
                      }
                      else {
                        if (sVar19 == 0x10) {
                          sVar19 = 0x10;
                          first = "proxy-connection";
                        }
                        else {
                          if (sVar19 != 0x11) goto LAB_0052d6d8;
                          sVar19 = 0x11;
                          first = "transfer-encoding";
                        }
LAB_0052d614:
                        iVar7 = Curl_strncasecompare(first,pcVar15,sVar19);
                        if (iVar7 == 0) goto LAB_0052d6d8;
                      }
LAB_0052d626:
                      sVar17 = sVar17 - 1;
                    }
                    pcVar10 = pcVar13;
                    if (sVar17 <= local_80) {
                      if ((local_60 != 0) && (local_60 != 3)) {
                        pcVar10 = phVar9->header[local_60].name;
                        sVar19 = phVar9->header[local_60].namelen;
                        ppcVar1 = &phVar9->header[local_60].value;
                        pcVar15 = *ppcVar1;
                        sVar4 = (size_t)ppcVar1[1];
                        if (3 < local_60) {
                          memmove(&phVar9[3].header[0].namelen,&phVar9[2].header[0].value,
                                  local_60 * 0x20 - 0x60);
                          local_60 = 3;
                        }
                        ppcVar1 = &phVar9->header[local_60].value;
                        *ppcVar1 = pcVar15;
                        ppcVar1[1] = (char *)sVar4;
                        phVar9->header[local_60].name = pcVar10;
                        phVar9->header[local_60].namelen = sVar19;
                      }
LAB_0052d77e:
                      if (sVar17 != 0) {
                        uVar8 = 0;
                        sVar19 = sVar17;
                        phVar6 = phVar9;
                        do {
                          psVar20 = &phVar6->header[0].valuelen;
                          sVar4 = phVar6->header[0].namelen;
                          sVar5 = *psVar20;
                          uVar8 = uVar8 + sVar4 + sVar5;
                          Curl_infof(data,"h2h3 [%.*s: %.*s]",sVar4,phVar6->header[0].name,sVar5,
                                     phVar6->header[0].value);
                          sVar19 = sVar19 - 1;
                          phVar6 = (h2h3req *)psVar20;
                        } while (sVar19 != 0);
                        if (60000 < uVar8) {
                          Curl_infof(data,
                                     "http_request: Warning: The cumulative length of all headers exceeds %d bytes and that could cause the stream to be rejected."
                                     ,60000);
                        }
                      }
                      phVar9->entries = sVar17;
                      *hp = phVar9;
                      return CURLE_OK;
                    }
                  } while( true );
                }
                break;
              }
              bVar21 = pcVar15 != (char *)0x0;
              pcVar15 = pcVar15 + -1;
            } while (bVar21);
          }
        }
      }
      goto LAB_0052d351;
    }
  }
  phVar9 = (h2h3req *)0x0;
LAB_0052d351:
  (*Curl_cfree)(phVar9);
  return CURLE_OUT_OF_MEMORY;
}

Assistant:

CURLcode Curl_pseudo_headers(struct Curl_easy *data,
                             const char *mem, /* the request */
                             const size_t len /* size of request */,
                             struct h2h3req **hp)
{
  struct connectdata *conn = data->conn;
  size_t nheader = 0;
  size_t i;
  size_t authority_idx;
  char *hdbuf = (char *)mem;
  char *end, *line_end;
  struct h2h3pseudo *nva = NULL;
  struct h2h3req *hreq = NULL;
  char *vptr;

  /* Calculate number of headers contained in [mem, mem + len). Assumes a
     correctly generated HTTP header field block. */
  for(i = 1; i < len; ++i) {
    if(hdbuf[i] == '\n' && hdbuf[i - 1] == '\r') {
      ++nheader;
      ++i;
    }
  }
  if(nheader < 2) {
    goto fail;
  }
  /* We counted additional 2 \r\n in the first and last line. We need 3
     new headers: :method, :path and :scheme. Therefore we need one
     more space. */
  nheader += 1;
  hreq = malloc(sizeof(struct h2h3req) +
                sizeof(struct h2h3pseudo) * (nheader - 1));
  if(!hreq) {
    goto fail;
  }

  nva = &hreq->header[0];

  /* Extract :method, :path from request line
     We do line endings with CRLF so checking for CR is enough */
  line_end = memchr(hdbuf, '\r', len);
  if(!line_end) {
    goto fail;
  }

  /* Method does not contain spaces */
  end = memchr(hdbuf, ' ', line_end - hdbuf);
  if(!end || end == hdbuf)
    goto fail;
  nva[0].name = H2H3_PSEUDO_METHOD;
  nva[0].namelen = sizeof(H2H3_PSEUDO_METHOD) - 1;
  nva[0].value = hdbuf;
  nva[0].valuelen = (size_t)(end - hdbuf);

  hdbuf = end + 1;

  /* Path may contain spaces so scan backwards */
  end = NULL;
  for(i = (size_t)(line_end - hdbuf); i; --i) {
    if(hdbuf[i - 1] == ' ') {
      end = &hdbuf[i - 1];
      break;
    }
  }
  if(!end || end == hdbuf)
    goto fail;
  nva[1].name = H2H3_PSEUDO_PATH;
  nva[1].namelen = sizeof(H2H3_PSEUDO_PATH) - 1;
  nva[1].value = hdbuf;
  nva[1].valuelen = (end - hdbuf);

  nva[2].name = H2H3_PSEUDO_SCHEME;
  nva[2].namelen = sizeof(H2H3_PSEUDO_SCHEME) - 1;
  vptr = Curl_checkheaders(data, STRCONST(H2H3_PSEUDO_SCHEME));
  if(vptr) {
    vptr += sizeof(H2H3_PSEUDO_SCHEME);
    while(*vptr && ISBLANK(*vptr))
      vptr++;
    nva[2].value = vptr;
    infof(data, "set pseudo header %s to %s", H2H3_PSEUDO_SCHEME, vptr);
  }
  else {
    if(conn->handler->flags & PROTOPT_SSL)
      nva[2].value = "https";
    else
      nva[2].value = "http";
  }
  nva[2].valuelen = strlen((char *)nva[2].value);

  authority_idx = 0;
  i = 3;
  while(i < nheader) {
    size_t hlen;

    hdbuf = line_end + 2;

    /* check for next CR, but only within the piece of data left in the given
       buffer */
    line_end = memchr(hdbuf, '\r', len - (hdbuf - (char *)mem));
    if(!line_end || (line_end == hdbuf))
      goto fail;

    /* header continuation lines are not supported */
    if(*hdbuf == ' ' || *hdbuf == '\t')
      goto fail;

    for(end = hdbuf; end < line_end && *end != ':'; ++end)
      ;
    if(end == hdbuf || end == line_end)
      goto fail;
    hlen = end - hdbuf;

    if(hlen == 4 && strncasecompare("host", hdbuf, 4)) {
      authority_idx = i;
      nva[i].name = H2H3_PSEUDO_AUTHORITY;
      nva[i].namelen = sizeof(H2H3_PSEUDO_AUTHORITY) - 1;
    }
    else {
      nva[i].namelen = (size_t)(end - hdbuf);
      /* Lower case the header name for HTTP/3 */
      Curl_strntolower((char *)hdbuf, hdbuf, nva[i].namelen);
      nva[i].name = hdbuf;
    }
    hdbuf = end + 1;
    while(*hdbuf == ' ' || *hdbuf == '\t')
      ++hdbuf;
    end = line_end;

    switch(inspect_header((const char *)nva[i].name, nva[i].namelen, hdbuf,
                          end - hdbuf)) {
    case HEADERINST_IGNORE:
      /* skip header fields prohibited by HTTP/2 specification. */
      --nheader;
      continue;
    case HEADERINST_TE_TRAILERS:
      nva[i].value = "trailers";
      nva[i].valuelen = sizeof("trailers") - 1;
      break;
    default:
      nva[i].value = hdbuf;
      nva[i].valuelen = (end - hdbuf);
    }

    ++i;
  }

  /* :authority must come before non-pseudo header fields */
  if(authority_idx && authority_idx != AUTHORITY_DST_IDX) {
    struct h2h3pseudo authority = nva[authority_idx];
    for(i = authority_idx; i > AUTHORITY_DST_IDX; --i) {
      nva[i] = nva[i - 1];
    }
    nva[i] = authority;
  }

  /* Warn stream may be rejected if cumulative length of headers is too
     large. */
#define MAX_ACC 60000  /* <64KB to account for some overhead */
  {
    size_t acc = 0;

    for(i = 0; i < nheader; ++i) {
      acc += nva[i].namelen + nva[i].valuelen;

      infof(data, "h2h3 [%.*s: %.*s]",
            (int)nva[i].namelen, nva[i].name,
            (int)nva[i].valuelen, nva[i].value);
    }

    if(acc > MAX_ACC) {
      infof(data, "http_request: Warning: The cumulative length of all "
            "headers exceeds %d bytes and that could cause the "
            "stream to be rejected.", MAX_ACC);
    }
  }

  hreq->entries = nheader;
  *hp = hreq;

  return CURLE_OK;

  fail:
  free(hreq);
  return CURLE_OUT_OF_MEMORY;
}